

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O1

Mio_Library_t * Mio_LibraryRead(char *FileName,char *pBuffer,char *ExcludeFile,int fVerbose)

{
  uint uVar1;
  st__table *tExcludeGate;
  size_t sVar2;
  char *__dest;
  Mio_Library_t *pMVar3;
  char *pcVar4;
  char *pcVar5;
  int fVerbose_00;
  
  if (ExcludeFile == (char *)0x0) {
    tExcludeGate = (st__table *)0x0;
    fVerbose_00 = fVerbose;
  }
  else {
    tExcludeGate = st__init_table(strcmp,st__strhash);
    uVar1 = Mio_LibraryReadExclude(ExcludeFile,tExcludeGate);
    if (uVar1 == 0xffffffff) {
      st__free_table(tExcludeGate);
      return (Mio_Library_t *)0x0;
    }
    fVerbose_00 = 0xf2c020;
    fprintf(_stdout,"Read %d gates from exclude file\n",(ulong)uVar1);
  }
  if (pBuffer == (char *)0x0) {
    __dest = (char *)0x0;
    fVerbose_00 = fVerbose;
    pMVar3 = Mio_LibraryReadOne(FileName,0,tExcludeGate,fVerbose);
  }
  else {
    sVar2 = strlen(pBuffer);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,pBuffer);
    pMVar3 = Mio_LibraryReadBuffer(pBuffer,0,tExcludeGate,fVerbose_00);
    if (pMVar3 == (Mio_Library_t *)0x0) {
      pMVar3 = (Mio_Library_t *)0x0;
    }
    else {
      pcVar4 = Extra_FileNameGenericAppend(FileName,".genlib");
      if (pcVar4 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar2 = strlen(pcVar4);
        pcVar5 = (char *)malloc(sVar2 + 1);
        strcpy(pcVar5,pcVar4);
      }
      pMVar3->pName = pcVar5;
    }
  }
  if (pMVar3 == (Mio_Library_t *)0x0) {
    if (pBuffer == (char *)0x0) {
      pMVar3 = Mio_LibraryReadOne(FileName,1,tExcludeGate,fVerbose);
    }
    else {
      pMVar3 = Mio_LibraryReadBuffer(__dest,1,tExcludeGate,fVerbose_00);
      if (pMVar3 == (Mio_Library_t *)0x0) {
        pMVar3 = (Mio_Library_t *)0x0;
      }
      else {
        pcVar4 = Extra_FileNameGenericAppend(FileName,".genlib");
        if (pcVar4 == (char *)0x0) {
          pcVar5 = (char *)0x0;
        }
        else {
          sVar2 = strlen(pcVar4);
          pcVar5 = (char *)malloc(sVar2 + 1);
          strcpy(pcVar5,pcVar4);
        }
        pMVar3->pName = pcVar5;
      }
    }
    if (pMVar3 == (Mio_Library_t *)0x0) {
      pMVar3 = (Mio_Library_t *)0x0;
    }
    else {
      puts("Warning: Read extended genlib format but ignoring extensions");
    }
  }
  if (__dest != (char *)0x0) {
    free(__dest);
  }
  if (tExcludeGate != (st__table *)0x0) {
    st__free_table(tExcludeGate);
  }
  return pMVar3;
}

Assistant:

Mio_Library_t * Mio_LibraryRead( char * FileName, char * pBuffer, char * ExcludeFile, int fVerbose )
{
    Mio_Library_t * pLib;
    int num;
    char * pBufferCopy;

    st__table * tExcludeGate = 0;

    if ( ExcludeFile )
    {
        tExcludeGate = st__init_table(strcmp, st__strhash);
        if ( (num = Mio_LibraryReadExclude( ExcludeFile, tExcludeGate )) == -1 )
        {
            st__free_table( tExcludeGate );
            tExcludeGate = 0;
            return 0;
        }
        fprintf ( stdout, "Read %d gates from exclude file\n", num );
    }

    pBufferCopy = Abc_UtilStrsav(pBuffer);
    if ( pBuffer == NULL )
        pLib = Mio_LibraryReadOne( FileName, 0, tExcludeGate, fVerbose );       // try normal format first ..
    else
    {
        pLib = Mio_LibraryReadBuffer( pBuffer, 0, tExcludeGate, fVerbose );       // try normal format first ..
        if ( pLib )
            pLib->pName = Abc_UtilStrsav( Extra_FileNameGenericAppend(FileName, ".genlib") );
    }
    if ( pLib == NULL )
    {
        if ( pBuffer == NULL )
            pLib = Mio_LibraryReadOne( FileName, 1, tExcludeGate, fVerbose );       // try normal format first ..
        else
        {
            pLib = Mio_LibraryReadBuffer( pBufferCopy, 1, tExcludeGate, fVerbose );       // try normal format first ..
            if ( pLib )
                pLib->pName = Abc_UtilStrsav( Extra_FileNameGenericAppend(FileName, ".genlib") );
        }
        if ( pLib != NULL )
            printf ( "Warning: Read extended genlib format but ignoring extensions\n" );
    }
    ABC_FREE( pBufferCopy );
    if ( tExcludeGate )
        st__free_table( tExcludeGate );

    return pLib;
}